

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindowSettings *this;
  ImGuiWindowSettings *p;
  ImGuiTextBuffer *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  char *settings_name;
  ImGuiWindowSettings *settings_1;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  int i;
  ImGuiContext *g;
  ImGuiTextBuffer *this_00;
  ImGuiWindowSettings *in_stack_ffffffffffffffa8;
  ImVec2ih in_stack_ffffffffffffffc0;
  ImVec2ih in_stack_ffffffffffffffc4;
  ImGuiWindowSettings *in_stack_ffffffffffffffc8;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  int local_24;
  
  for (local_24 = 0; local_24 != *(int *)(in_RDI + 0x3e40); local_24 = local_24 + 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)(in_RDI + 0x3e40),local_24);
    in_stack_ffffffffffffffd0 = *ppIVar2;
    if ((in_stack_ffffffffffffffd0->Flags & 0x100U) == 0) {
      if (in_stack_ffffffffffffffd0->SettingsOffset == -1) {
        in_stack_ffffffffffffffa8 =
             ImGui::FindWindowSettings((ImGuiID)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
      else {
        in_stack_ffffffffffffffa8 =
             ImChunkStream<ImGuiWindowSettings>::ptr_from_offset
                       ((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x5b78),
                        in_stack_ffffffffffffffd0->SettingsOffset);
      }
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffa8;
      if (in_stack_ffffffffffffffa8 == (ImGuiWindowSettings *)0x0) {
        in_stack_ffffffffffffffc8 = ImGui::CreateNewWindowSettings(in_RDI);
        iVar1 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr
                          ((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x5b78),
                           in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffd0->SettingsOffset = iVar1;
      }
      ImVec2ih::ImVec2ih((ImVec2ih *)&stack0xffffffffffffffc4,&in_stack_ffffffffffffffd0->Pos);
      in_stack_ffffffffffffffc8->Pos = in_stack_ffffffffffffffc4;
      ImVec2ih::ImVec2ih((ImVec2ih *)&stack0xffffffffffffffc0,&in_stack_ffffffffffffffd0->SizeFull);
      in_stack_ffffffffffffffc8->Size = in_stack_ffffffffffffffc0;
      in_stack_ffffffffffffffc8->Collapsed = (bool)(in_stack_ffffffffffffffd0->Collapsed & 1);
    }
  }
  this_00 = in_RDX;
  iVar1 = ImGuiTextBuffer::size(in_RDX);
  ImChunkStream<ImGuiWindowSettings>::size((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x5b78));
  ImGuiTextBuffer::reserve(this_00,iVar1);
  for (this = ImChunkStream<ImGuiWindowSettings>::begin
                        ((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x5b78));
      this != (ImGuiWindowSettings *)0x0;
      this = ImChunkStream<ImGuiWindowSettings>::next_chunk
                       ((ImChunkStream<ImGuiWindowSettings> *)this,p)) {
    p = (ImGuiWindowSettings *)ImGuiWindowSettings::GetName(this);
    ImGuiTextBuffer::appendf(in_RDX,"[%s][%s]\n",*in_RSI,p);
    ImGuiTextBuffer::appendf
              (in_RDX,"Pos=%d,%d\n",(ulong)(uint)(int)(this->Pos).x,(ulong)(uint)(int)(this->Pos).y)
    ;
    ImGuiTextBuffer::appendf
              (in_RDX,"Size=%d,%d\n",(ulong)(uint)(int)(this->Size).x,
               (ulong)(uint)(int)(this->Size).y);
    ImGuiTextBuffer::appendf(in_RDX,"Collapsed=%d\n",(ulong)(this->Collapsed & 1));
    ImGuiTextBuffer::append
              ((ImGuiTextBuffer *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih(window->Pos);
        settings->Size = ImVec2ih(window->SizeFull);

        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->append("\n");
    }
}